

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma.c
# Opt level: O0

void pretty_header(state *s,ent *e)

{
  char *pcVar1;
  uint local_44;
  obj *obj;
  dma *dma;
  ent *e_local;
  state *s_local;
  
  if ((s->dma).size == 0) {
    (*(s->op).print)("%08x\n",(ulong)e->val);
  }
  else {
    if (s->subchan[(s->dma).subchan] == (obj *)0x0) {
      local_44 = 0;
    }
    else {
      local_44 = s->subchan[(s->dma).subchan]->handle;
    }
    pcVar1 = "constant";
    if ((s->dma).incr != 0) {
      pcVar1 = "increment";
    }
    (*(s->op).print)("%08x  size %d, subchannel %d (0x%x), offset 0x%04x, %s\n",(ulong)e->val,
                     (ulong)(uint)(s->dma).size,(ulong)(uint)(s->dma).subchan,(ulong)local_44,
                     (ulong)(uint)(s->dma).addr,pcVar1);
  }
  return;
}

Assistant:

static void
pretty_header(struct state *s, struct ent *e)
{
	struct dma *dma = &s->dma;
	struct obj *obj = s->subchan[dma->subchan];

	if (dma->size)
		s->op.print("%08x  size %d, subchannel %d (0x%x),"
			    " offset 0x%04x, %s\n", e->val, dma->size,
			    dma->subchan, (obj ? obj->handle : 0), dma->addr,
			    (dma->incr ? "increment" : "constant"));
	else
		s->op.print("%08x\n", e->val);
}